

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O2

void __thiscall cfd::core::BlindFactor::BlindFactor(BlindFactor *this,ByteData *byte_data)

{
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> _Stack_28;
  
  ByteData256::ByteData256((ByteData256 *)&_Stack_28,byte_data);
  BlindFactor(this,(ByteData256 *)&_Stack_28);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&_Stack_28);
  return;
}

Assistant:

BlindFactor::BlindFactor(const ByteData &byte_data)
    : BlindFactor(ByteData256(byte_data)) {
  // do nothing
}